

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O1

SVGPatternAttributes * __thiscall
lunasvg::SVGPatternElement::collectPatternAttributes
          (SVGPatternAttributes *__return_storage_ptr__,SVGPatternElement *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  char cVar4;
  SVGPatternElement *pSVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  SVGNodeList *pSVar8;
  _List_node_base *p_Var9;
  SVGPatternElement *current;
  set<const_lunasvg::SVGPatternElement_*,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
  processedPatterns;
  SVGPatternElement *local_68;
  _Rb_tree<const_lunasvg::SVGPatternElement_*,_const_lunasvg::SVGPatternElement_*,_std::_Identity<const_lunasvg::SVGPatternElement_*>,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
  local_60;
  
  __return_storage_ptr__->m_preserveAspectRatio = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_patternContentElement = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_patternContentUnits = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_viewBox = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_patternTransform = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_patternUnits = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_width = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_height = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_x = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_y = (SVGPatternElement *)0x0;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  do {
    if ((__return_storage_ptr__->m_x == (SVGPatternElement *)0x0) &&
       (bVar3 = SVGElement::hasAttribute((SVGElement *)local_68,X), bVar3)) {
      __return_storage_ptr__->m_x = local_68;
    }
    if ((__return_storage_ptr__->m_y == (SVGPatternElement *)0x0) &&
       (bVar3 = SVGElement::hasAttribute((SVGElement *)local_68,Y), bVar3)) {
      __return_storage_ptr__->m_y = local_68;
    }
    if ((__return_storage_ptr__->m_width == (SVGPatternElement *)0x0) &&
       (bVar3 = SVGElement::hasAttribute((SVGElement *)local_68,Width), bVar3)) {
      __return_storage_ptr__->m_width = local_68;
    }
    if ((__return_storage_ptr__->m_height == (SVGPatternElement *)0x0) &&
       (bVar3 = SVGElement::hasAttribute((SVGElement *)local_68,Height), bVar3)) {
      __return_storage_ptr__->m_height = local_68;
    }
    if ((__return_storage_ptr__->m_patternTransform == (SVGPatternElement *)0x0) &&
       (bVar3 = SVGElement::hasAttribute((SVGElement *)local_68,PatternTransform), bVar3)) {
      __return_storage_ptr__->m_patternTransform = local_68;
    }
    if ((__return_storage_ptr__->m_patternUnits == (SVGPatternElement *)0x0) &&
       (bVar3 = SVGElement::hasAttribute((SVGElement *)local_68,PatternUnits), bVar3)) {
      __return_storage_ptr__->m_patternUnits = local_68;
    }
    if ((__return_storage_ptr__->m_patternContentUnits == (SVGPatternElement *)0x0) &&
       (bVar3 = SVGElement::hasAttribute((SVGElement *)local_68,PatternContentUnits), bVar3)) {
      __return_storage_ptr__->m_patternContentUnits = local_68;
    }
    if ((__return_storage_ptr__->m_viewBox == (SVGPatternElement *)0x0) &&
       (bVar3 = SVGElement::hasAttribute((SVGElement *)local_68,ViewBox), bVar3)) {
      __return_storage_ptr__->m_viewBox = local_68;
    }
    if ((__return_storage_ptr__->m_preserveAspectRatio == (SVGPatternElement *)0x0) &&
       (bVar3 = SVGElement::hasAttribute((SVGElement *)local_68,PreserveAspectRatio), bVar3)) {
      __return_storage_ptr__->m_preserveAspectRatio = local_68;
    }
    if (__return_storage_ptr__->m_patternContentElement == (SVGPatternElement *)0x0) {
      pSVar8 = &(local_68->super_SVGPaintElement).super_SVGElement.m_children;
      p_Var9 = (_List_node_base *)pSVar8;
      do {
        p_Var9 = (((_List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
                    *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var9 == (_List_node_base *)pSVar8) goto LAB_00118fc8;
        cVar4 = (**(code **)(*(long *)p_Var9[1]._M_next + 0x18))();
      } while (cVar4 == '\0');
      __return_storage_ptr__->m_patternContentElement = local_68;
    }
LAB_00118fc8:
    pSVar5 = (SVGPatternElement *)
             SVGURIReference::getTargetElement
                       (&local_68->super_SVGURIReference,
                        (this->super_SVGPaintElement).super_SVGElement.super_SVGNode.m_document);
    if ((pSVar5 == (SVGPatternElement *)0x0) ||
       ((pSVar5->super_SVGPaintElement).super_SVGElement.m_id != Pattern)) break;
    std::
    _Rb_tree<lunasvg::SVGPatternElement_const*,lunasvg::SVGPatternElement_const*,std::_Identity<lunasvg::SVGPatternElement_const*>,std::less<lunasvg::SVGPatternElement_const*>,std::allocator<lunasvg::SVGPatternElement_const*>>
    ::_M_insert_unique<lunasvg::SVGPatternElement_const*const&>
              ((_Rb_tree<lunasvg::SVGPatternElement_const*,lunasvg::SVGPatternElement_const*,std::_Identity<lunasvg::SVGPatternElement_const*>,std::less<lunasvg::SVGPatternElement_const*>,std::allocator<lunasvg::SVGPatternElement_const*>>
                *)&local_60,&local_68);
    p_Var6 = &p_Var1->_M_header;
    for (p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
        p_Var2 = (&p_Var2->_M_left)[*(SVGPatternElement **)(p_Var2 + 1) < pSVar5]) {
      if (*(SVGPatternElement **)(p_Var2 + 1) >= pSVar5) {
        p_Var6 = p_Var2;
      }
    }
    p_Var7 = p_Var1;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (p_Var7 = (_Rb_tree_header *)p_Var6,
       pSVar5 < (SVGPatternElement *)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
      p_Var7 = p_Var1;
    }
    local_68 = pSVar5;
  } while (p_Var7 == p_Var1);
  SVGPatternAttributes::setDefaultValues(__return_storage_ptr__,this);
  std::
  _Rb_tree<const_lunasvg::SVGPatternElement_*,_const_lunasvg::SVGPatternElement_*,_std::_Identity<const_lunasvg::SVGPatternElement_*>,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

SVGPatternAttributes SVGPatternElement::collectPatternAttributes() const
{
    SVGPatternAttributes attributes;
    std::set<const SVGPatternElement*> processedPatterns;
    const SVGPatternElement* current = this;
    while(true) {
        if(!attributes.hasX() && current->hasAttribute(PropertyID::X))
            attributes.setX(current);
        if(!attributes.hasY() && current->hasAttribute(PropertyID::Y))
            attributes.setY(current);
        if(!attributes.hasWidth() && current->hasAttribute(PropertyID::Width))
            attributes.setWidth(current);
        if(!attributes.hasHeight() && current->hasAttribute(PropertyID::Height))
            attributes.setHeight(current);
        if(!attributes.hasPatternTransform() && current->hasAttribute(PropertyID::PatternTransform))
            attributes.setPatternTransform(current);
        if(!attributes.hasPatternUnits() && current->hasAttribute(PropertyID::PatternUnits))
            attributes.setPatternUnits(current);
        if(!attributes.hasPatternContentUnits() && current->hasAttribute(PropertyID::PatternContentUnits))
            attributes.setPatternContentUnits(current);
        if(!attributes.hasViewBox() && current->hasAttribute(PropertyID::ViewBox))
            attributes.setViewBox(current);
        if(!attributes.hasPreserveAspectRatio() && current->hasAttribute(PropertyID::PreserveAspectRatio))
            attributes.setPreserveAspectRatio(current);
        if(!attributes.hasPatternContentElement()) {
            for(const auto& child : current->children()) {
                if(child->isElement()) {
                    attributes.setPatternContentElement(current);
                    break;
                }
            }
        }

        auto targetElement = current->getTargetElement(document());
        if(!targetElement || targetElement->id() != ElementID::Pattern)
            break;
        processedPatterns.insert(current);
        current = static_cast<const SVGPatternElement*>(targetElement);
        if(processedPatterns.count(current) > 0) {
            break;
        }
    }

    attributes.setDefaultValues(this);
    return attributes;
}